

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O2

void __thiscall arith_uint256_tests::bignum_SetCompact::test_method(bignum_SetCompact *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  string *psVar3;
  bool *pbVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  char *local_f78;
  char *local_f70;
  undefined1 *local_f68;
  undefined1 *local_f60;
  char *local_f58;
  char *local_f50;
  char *local_f48;
  char *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  char *local_f28;
  char *local_f20;
  char *local_f18;
  char *local_f10;
  undefined1 *local_f08;
  undefined1 *local_f00;
  char *local_ef8;
  char *local_ef0;
  char *local_ee8;
  char *local_ee0;
  undefined1 *local_ed8;
  undefined1 *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  char *local_eb0;
  undefined1 *local_ea8;
  undefined1 *local_ea0;
  char *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  undefined1 *local_e78;
  undefined1 *local_e70;
  char *local_e68;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  undefined1 *local_e48;
  undefined1 *local_e40;
  char *local_e38;
  char *local_e30;
  char *local_e28;
  char *local_e20;
  undefined1 *local_e18;
  undefined1 *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  undefined1 *local_de8;
  undefined1 *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_dc0;
  undefined1 *local_db8;
  undefined1 *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  char *local_d90;
  undefined1 *local_d88;
  undefined1 *local_d80;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  undefined1 *local_d58;
  undefined1 *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  char *local_d30;
  undefined1 *local_d28;
  undefined1 *local_d20;
  char *local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_cd0;
  undefined1 *local_cc8;
  undefined1 *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  undefined1 *local_c68;
  undefined1 *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  char *local_c18;
  char *local_c10;
  undefined1 *local_c08;
  undefined1 *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  char *local_be0;
  undefined1 *local_bd8;
  undefined1 *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  undefined1 *local_ba8;
  undefined1 *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  undefined1 *local_a88;
  undefined1 *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined4 local_104;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  bool fOverflow;
  bool fNegative;
  string local_98;
  undefined1 local_78 [24];
  char *local_60;
  arith_uint256 num;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&num.super_base_uint<256U>);
  arith_uint256::SetCompact((arith_uint256 *)&num.super_base_uint<256U>,0,&fNegative,&fOverflow);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x19f;
  file.m_begin = (iterator)&local_b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c8 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num.super_base_uint<256U>);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_d0,0x19f,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x1a0;
  file_00.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f0,msg_00
            );
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f8 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_100,0x1a0,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x1a1;
  file_01.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_128,
             msg_01);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_130 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_138,0x1a1,1,2,pbVar4,"fNegative",&local_98,"false");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pbVar4;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x1a2;
  file_02.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_160 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_168,0x1a2,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x123456,&fNegative,&fOverflow);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pbVar4;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x1a5;
  file_03.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_188,
             msg_03);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_190 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_198,0x1a5,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x1a6;
  file_04.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b8,
             msg_04);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1c0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_1c8,0x1a6,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x1a7;
  file_05.m_begin = (iterator)&local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1e8,
             msg_05);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_1f0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_1f8,0x1a7,1,2,pbVar4,"fNegative",&local_98,"false");
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pbVar4;
  msg_06.m_begin = pvVar2;
  file_06.m_end = (iterator)0x1a8;
  file_06.m_begin = (iterator)&local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_218,
             msg_06);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_220 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_228,0x1a8,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x1003456,&fNegative,&fOverflow);
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pbVar4;
  msg_07.m_begin = pvVar2;
  file_07.m_end = (iterator)0x1ab;
  file_07.m_begin = (iterator)&local_238;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_248,
             msg_07);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_250 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_258,0x1ab,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)psVar3;
  msg_08.m_begin = pvVar2;
  file_08.m_end = (iterator)0x1ac;
  file_08.m_begin = (iterator)&local_268;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_278,
             msg_08);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_280 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_288,0x1ac,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)psVar3;
  msg_09.m_begin = pvVar2;
  file_09.m_end = (iterator)0x1ad;
  file_09.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2a8,
             msg_09);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2b0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_2b8,0x1ad,1,2,pbVar4,"fNegative",&local_98,"false");
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pbVar4;
  msg_10.m_begin = pvVar2;
  file_10.m_end = (iterator)0x1ae;
  file_10.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d8,
             msg_10);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2e0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_2e8,0x1ae,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x2000056,&fNegative,&fOverflow);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pbVar4;
  msg_11.m_begin = pvVar2;
  file_11.m_end = (iterator)0x1b1;
  file_11.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_308,
             msg_11);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_310 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_318,0x1b1,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)psVar3;
  msg_12.m_begin = pvVar2;
  file_12.m_end = (iterator)0x1b2;
  file_12.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_338,
             msg_12);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_340 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_348,0x1b2,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)psVar3;
  msg_13.m_begin = pvVar2;
  file_13.m_end = (iterator)0x1b3;
  file_13.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_368,
             msg_13);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_370 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_378,0x1b3,1,2,pbVar4,"fNegative",&local_98,"false");
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pbVar4;
  msg_14.m_begin = pvVar2;
  file_14.m_end = (iterator)0x1b4;
  file_14.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_398,
             msg_14);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3a0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_3a8,0x1b4,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x3000000,&fNegative,&fOverflow);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pbVar4;
  msg_15.m_begin = pvVar2;
  file_15.m_end = (iterator)0x1b7;
  file_15.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3c8,
             msg_15);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3d0 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_3d8,0x1b7,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)psVar3;
  msg_16.m_begin = pvVar2;
  file_16.m_end = (iterator)0x1b8;
  file_16.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3f8,
             msg_16);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_400 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_408,0x1b8,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)psVar3;
  msg_17.m_begin = pvVar2;
  file_17.m_end = (iterator)0x1b9;
  file_17.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_428,
             msg_17);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_430 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_438,0x1b9,1,2,pbVar4,"fNegative",&local_98,"false");
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pbVar4;
  msg_18.m_begin = pvVar2;
  file_18.m_end = (iterator)0x1ba;
  file_18.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_458,
             msg_18);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_460 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_468,0x1ba,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x4000000,&fNegative,&fOverflow);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pbVar4;
  msg_19.m_begin = pvVar2;
  file_19.m_end = (iterator)0x1bd;
  file_19.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_488,
             msg_19);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_490 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_498,0x1bd,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = (iterator)psVar3;
  msg_20.m_begin = pvVar2;
  file_20.m_end = (iterator)0x1be;
  file_20.m_begin = (iterator)&local_4a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4b8,
             msg_20);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4c0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_4c8,0x1be,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)psVar3;
  msg_21.m_begin = pvVar2;
  file_21.m_end = (iterator)0x1bf;
  file_21.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4e8,
             msg_21);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_4f0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_4f8,0x1bf,1,2,pbVar4,"fNegative",&local_98,"false");
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pbVar4;
  msg_22.m_begin = pvVar2;
  file_22.m_end = (iterator)0x1c0;
  file_22.m_begin = (iterator)&local_508;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_518,
             msg_22);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_520 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_528,0x1c0,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x923456,&fNegative,&fOverflow);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pbVar4;
  msg_23.m_begin = pvVar2;
  file_23.m_end = (iterator)0x1c3;
  file_23.m_begin = (iterator)&local_538;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_548,
             msg_23);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_550 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_558,0x1c3,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = (iterator)psVar3;
  msg_24.m_begin = pvVar2;
  file_24.m_end = (iterator)0x1c4;
  file_24.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_578,
             msg_24);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_580 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_588,0x1c4,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = (iterator)psVar3;
  msg_25.m_begin = pvVar2;
  file_25.m_end = (iterator)0x1c5;
  file_25.m_begin = (iterator)&local_598;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5a8,
             msg_25);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5b0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_5b8,0x1c5,1,2,pbVar4,"fNegative",&local_98,"false");
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pbVar4;
  msg_26.m_begin = pvVar2;
  file_26.m_end = (iterator)0x1c6;
  file_26.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_5d8,
             msg_26);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5e0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_5e8,0x1c6,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x1803456,&fNegative,&fOverflow);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pbVar4;
  msg_27.m_begin = pvVar2;
  file_27.m_end = (iterator)0x1c9;
  file_27.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_608,
             msg_27);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_610 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_618,0x1c9,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = (iterator)psVar3;
  msg_28.m_begin = pvVar2;
  file_28.m_end = (iterator)0x1ca;
  file_28.m_begin = (iterator)&local_628;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_638,
             msg_28);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_640 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_648,0x1ca,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = (iterator)psVar3;
  msg_29.m_begin = pvVar2;
  file_29.m_end = (iterator)0x1cb;
  file_29.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_668,
             msg_29);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_670 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_678,0x1cb,1,2,pbVar4,"fNegative",&local_98,"false");
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pbVar4;
  msg_30.m_begin = pvVar2;
  file_30.m_end = (iterator)0x1cc;
  file_30.m_begin = (iterator)&local_688;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_698,
             msg_30);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6a0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_6a8,0x1cc,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x2800056,&fNegative,&fOverflow);
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pbVar4;
  msg_31.m_begin = pvVar2;
  file_31.m_end = (iterator)0x1cf;
  file_31.m_begin = (iterator)&local_6b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_6c8,
             msg_31);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6d0 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_6d8,0x1cf,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = (iterator)psVar3;
  msg_32.m_begin = pvVar2;
  file_32.m_end = (iterator)0x1d0;
  file_32.m_begin = (iterator)&local_6e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_6f8,
             msg_32);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_700 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_708,0x1d0,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = (iterator)psVar3;
  msg_33.m_begin = pvVar2;
  file_33.m_end = (iterator)0x1d1;
  file_33.m_begin = (iterator)&local_718;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_728,
             msg_33);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_730 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_738,0x1d1,1,2,pbVar4,"fNegative",&local_98,"false");
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pbVar4;
  msg_34.m_begin = pvVar2;
  file_34.m_end = (iterator)0x1d2;
  file_34.m_begin = (iterator)&local_748;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_758,
             msg_34);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_760 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_768,0x1d2,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x3800000,&fNegative,&fOverflow);
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pbVar4;
  msg_35.m_begin = pvVar2;
  file_35.m_end = (iterator)0x1d5;
  file_35.m_begin = (iterator)&local_778;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_788,
             msg_35);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_790 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_798,0x1d5,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7a0 = "";
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = (iterator)psVar3;
  msg_36.m_begin = pvVar2;
  file_36.m_end = (iterator)0x1d6;
  file_36.m_begin = (iterator)&local_7a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7b8,
             msg_36);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7c0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_7c8,0x1d6,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = (iterator)psVar3;
  msg_37.m_begin = pvVar2;
  file_37.m_end = (iterator)0x1d7;
  file_37.m_begin = (iterator)&local_7d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_7e8,
             msg_37);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_7f0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_7f8,0x1d7,1,2,pbVar4,"fNegative",&local_98,"false");
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = pbVar4;
  msg_38.m_begin = pvVar2;
  file_38.m_end = (iterator)0x1d8;
  file_38.m_begin = (iterator)&local_808;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_818,
             msg_38);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_820 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_828,0x1d8,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x4800000,&fNegative,&fOverflow);
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_830 = "";
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pbVar4;
  msg_39.m_begin = pvVar2;
  file_39.m_end = (iterator)0x1db;
  file_39.m_begin = (iterator)&local_838;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_848,
             msg_39);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_858 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_850 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_858,0x1db,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000000",
             "\"0000000000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_860 = "";
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = (iterator)psVar3;
  msg_40.m_begin = pvVar2;
  file_40.m_end = (iterator)0x1dc;
  file_40.m_begin = (iterator)&local_868;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_878,
             msg_40);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_880 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_888,0x1dc,1,2,psVar3,"num.GetCompact()",&local_104,"0U");
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_890 = "";
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = (iterator)psVar3;
  msg_41.m_begin = pvVar2;
  file_41.m_end = (iterator)0x1dd;
  file_41.m_begin = (iterator)&local_898;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8a8,
             msg_41);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8b0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_8b8,0x1dd,1,2,pbVar4,"fNegative",&local_98,"false");
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = pbVar4;
  msg_42.m_begin = pvVar2;
  file_42.m_end = (iterator)0x1de;
  file_42.m_begin = (iterator)&local_8c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_8d8,
             msg_42);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8e0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_8e8,0x1de,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x1123456,&fNegative,&fOverflow);
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_43.m_end = pbVar4;
  msg_43.m_begin = pvVar2;
  file_43.m_end = (iterator)0x1e1;
  file_43.m_begin = (iterator)&local_8f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_908,
             msg_43);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_910 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_918,0x1e1,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000000012",
             "\"0000000000000000000000000000000000000000000000000000000000000012\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_920 = "";
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_44.m_end = (iterator)psVar3;
  msg_44.m_begin = pvVar2;
  file_44.m_end = (iterator)0x1e2;
  file_44.m_begin = (iterator)&local_928;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_938,
             msg_44);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_948 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_940 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0x1120000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_948,0x1e2,1,2,psVar3,"num.GetCompact()",&local_104,"0x01120000U");
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_950 = "";
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_45.m_end = (iterator)psVar3;
  msg_45.m_begin = pvVar2;
  file_45.m_end = (iterator)0x1e3;
  file_45.m_begin = (iterator)&local_958;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_968,
             msg_45);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_978 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_970 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_978,0x1e3,1,2,pbVar4,"fNegative",&local_98,"false");
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_980 = "";
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = pbVar4;
  msg_46.m_begin = pvVar2;
  file_46.m_end = (iterator)0x1e4;
  file_46.m_begin = (iterator)&local_988;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_998,
             msg_46);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_9a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9a0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pbVar4 = &fOverflow;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_9a8,0x1e4,1,2,pbVar4,"fOverflow",&local_98,"false");
  base_uint<256U>::base_uint((base_uint<256U> *)local_78,0x80);
  base_uint<256U>::operator=(&num.super_base_uint<256U>,(base_uint<256U> *)local_78);
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9b0 = "";
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = pbVar4;
  msg_47.m_begin = pvVar2;
  file_47.m_end = (iterator)0x1e8;
  file_47.m_begin = (iterator)&local_9b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_9c8,
             msg_47);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_9d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9d0 = "";
  local_98._M_dataplus._M_p._0_4_ =
       arith_uint256::GetCompact((arith_uint256 *)&num.super_base_uint<256U>,false);
  psVar3 = &local_98;
  local_104 = 0x2008000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_9d8,0x1e8,1,2,psVar3,"num.GetCompact()",&local_104,"0x02008000U");
  arith_uint256::SetCompact(&num,0x1fedcba,&fNegative,&fOverflow);
  local_9e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_9e0 = "";
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_48.m_end = (iterator)psVar3;
  msg_48.m_begin = pvVar2;
  file_48.m_end = (iterator)0x1eb;
  file_48.m_begin = (iterator)&local_9e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_9f8,
             msg_48);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a00 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_a08,0x1eb,1,2,psVar3,"num.GetHex()",
             "000000000000000000000000000000000000000000000000000000000000007e",
             "\"000000000000000000000000000000000000000000000000000000000000007e\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a10 = "";
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_49.m_end = (iterator)psVar3;
  msg_49.m_begin = pvVar2;
  file_49.m_end = (iterator)0x1ec;
  file_49.m_begin = (iterator)&local_a18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_a28,
             msg_49);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a30 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,true);
  psVar3 = &local_98;
  local_104 = 0x1fe0000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_a38,0x1ec,1,2,psVar3,"num.GetCompact(true)",&local_104,"0x01fe0000U");
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a40 = "";
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_50.m_end = (iterator)psVar3;
  msg_50.m_begin = pvVar2;
  file_50.m_end = (iterator)0x1ed;
  file_50.m_begin = (iterator)&local_a48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_a58,
             msg_50);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a60 = "";
  local_98._M_dataplus._M_p._0_1_ = 1;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_a68,0x1ed,1,2,pbVar4,"fNegative",&local_98,"true");
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a70 = "";
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_51.m_end = pbVar4;
  msg_51.m_begin = pvVar2;
  file_51.m_end = (iterator)0x1ee;
  file_51.m_begin = (iterator)&local_a78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_a88,
             msg_51);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_a90 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p._1_3_ << 8;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_a98,0x1ee,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x2123456,&fNegative,&fOverflow);
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_aa0 = "";
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_52.m_end = pbVar4;
  msg_52.m_begin = pvVar2;
  file_52.m_end = (iterator)0x1f1;
  file_52.m_begin = (iterator)&local_aa8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_ab8,
             msg_52);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_ac8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ac0 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_ac8,0x1f1,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000001234",
             "\"0000000000000000000000000000000000000000000000000000000000001234\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_ad8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ad0 = "";
  local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_53.m_end = (iterator)psVar3;
  msg_53.m_begin = pvVar2;
  file_53.m_end = (iterator)0x1f2;
  file_53.m_begin = (iterator)&local_ad8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_ae8,
             msg_53);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_af8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_af0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0x2123400;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_af8,0x1f2,1,2,psVar3,"num.GetCompact()",&local_104,"0x02123400U");
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b00 = "";
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_54.m_end = (iterator)psVar3;
  msg_54.m_begin = pvVar2;
  file_54.m_end = (iterator)0x1f3;
  file_54.m_begin = (iterator)&local_b08;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_b18,
             msg_54);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_b28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b20 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_b28,499,1,2,pbVar4,"fNegative",&local_98,"false");
  local_b38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b30 = "";
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_55.m_end = pbVar4;
  msg_55.m_begin = pvVar2;
  file_55.m_end = (iterator)0x1f4;
  file_55.m_begin = (iterator)&local_b38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_b48,
             msg_55);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_b58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b50 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_b58,500,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x3123456,&fNegative,&fOverflow);
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b60 = "";
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_56.m_end = pbVar4;
  msg_56.m_begin = pvVar2;
  file_56.m_end = (iterator)0x1f7;
  file_56.m_begin = (iterator)&local_b68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_b78,
             msg_56);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b80 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_b88,0x1f7,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000000123456",
             "\"0000000000000000000000000000000000000000000000000000000000123456\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_b90 = "";
  local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_57.m_end = (iterator)psVar3;
  msg_57.m_begin = pvVar2;
  file_57.m_end = (iterator)0x1f8;
  file_57.m_begin = (iterator)&local_b98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_ba8,
             msg_57);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_bb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_bb0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0x3123456;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_bb8,0x1f8,1,2,psVar3,"num.GetCompact()",&local_104,"0x03123456U");
  local_bc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_bc0 = "";
  local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_58.m_end = (iterator)psVar3;
  msg_58.m_begin = pvVar2;
  file_58.m_end = (iterator)0x1f9;
  file_58.m_begin = (iterator)&local_bc8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_bd8,
             msg_58);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_be8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_be0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_be8,0x1f9,1,2,pbVar4,"fNegative",&local_98,"false");
  local_bf8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_bf0 = "";
  local_c08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c00 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_59.m_end = pbVar4;
  msg_59.m_begin = pvVar2;
  file_59.m_end = (iterator)0x1fa;
  file_59.m_begin = (iterator)&local_bf8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_c08,
             msg_59);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_c18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c10 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_c18,0x1fa,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x4123456,&fNegative,&fOverflow);
  local_c28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c20 = "";
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_60.m_end = pbVar4;
  msg_60.m_begin = pvVar2;
  file_60.m_end = (iterator)0x1fd;
  file_60.m_begin = (iterator)&local_c28;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_c38,
             msg_60);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_c48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c40 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_c48,0x1fd,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000012345600",
             "\"0000000000000000000000000000000000000000000000000000000012345600\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_c58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c50 = "";
  local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_61.m_end = (iterator)psVar3;
  msg_61.m_begin = pvVar2;
  file_61.m_end = (iterator)0x1fe;
  file_61.m_begin = (iterator)&local_c58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_c68,
             msg_61);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_c78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c70 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0x4123456;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_c78,0x1fe,1,2,psVar3,"num.GetCompact()",&local_104,"0x04123456U");
  local_c88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_c80 = "";
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_62.m_end = (iterator)psVar3;
  msg_62.m_begin = pvVar2;
  file_62.m_end = (iterator)0x1ff;
  file_62.m_begin = (iterator)&local_c88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_c98,
             msg_62);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_ca8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ca0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_ca8,0x1ff,1,2,pbVar4,"fNegative",&local_98,"false");
  local_cb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_cb0 = "";
  local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_63.m_end = pbVar4;
  msg_63.m_begin = pvVar2;
  file_63.m_end = (iterator)0x200;
  file_63.m_begin = (iterator)&local_cb8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_cc8,
             msg_63);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_cd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_cd0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_cd8,0x200,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x4923456,&fNegative,&fOverflow);
  local_ce8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ce0 = "";
  local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_64.m_end = pbVar4;
  msg_64.m_begin = pvVar2;
  file_64.m_end = (iterator)0x203;
  file_64.m_begin = (iterator)&local_ce8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_cf8,
             msg_64);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_d08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d00 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_d08,0x203,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000012345600",
             "\"0000000000000000000000000000000000000000000000000000000012345600\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_d18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d10 = "";
  local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_65.m_end = (iterator)psVar3;
  msg_65.m_begin = pvVar2;
  file_65.m_end = (iterator)0x204;
  file_65.m_begin = (iterator)&local_d18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_d28,
             msg_65);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_d38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d30 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,true);
  psVar3 = &local_98;
  local_104 = 0x4923456;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_d38,0x204,1,2,psVar3,"num.GetCompact(true)",&local_104,"0x04923456U");
  local_d48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d40 = "";
  local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_66.m_end = (iterator)psVar3;
  msg_66.m_begin = pvVar2;
  file_66.m_end = (iterator)0x205;
  file_66.m_begin = (iterator)&local_d48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_d58,
             msg_66);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_d68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d60 = "";
  local_98._M_dataplus._M_p._0_1_ = 1;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_d68,0x205,1,2,pbVar4,"fNegative",&local_98,"true");
  local_d78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d70 = "";
  local_d88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_67.m_end = pbVar4;
  msg_67.m_begin = pvVar2;
  file_67.m_end = (iterator)0x206;
  file_67.m_begin = (iterator)&local_d78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_d88,
             msg_67);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_d98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_d90 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p._1_3_ << 8;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_d98,0x206,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x5009234,&fNegative,&fOverflow);
  local_da8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_da0 = "";
  local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_68.m_end = pbVar4;
  msg_68.m_begin = pvVar2;
  file_68.m_end = (iterator)0x209;
  file_68.m_begin = (iterator)&local_da8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_db8,
             msg_68);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_dc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_dc0 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_dc8,0x209,1,2,psVar3,"num.GetHex()",
             "0000000000000000000000000000000000000000000000000000000092340000",
             "\"0000000000000000000000000000000000000000000000000000000092340000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_dd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_dd0 = "";
  local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_de0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_69.m_end = (iterator)psVar3;
  msg_69.m_begin = pvVar2;
  file_69.m_end = (iterator)0x20a;
  file_69.m_begin = (iterator)&local_dd8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_de8,
             msg_69);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_df8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_df0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0x5009234;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_df8,0x20a,1,2,psVar3,"num.GetCompact()",&local_104,"0x05009234U");
  local_e08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e00 = "";
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e10 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_70.m_end = (iterator)psVar3;
  msg_70.m_begin = pvVar2;
  file_70.m_end = (iterator)0x20b;
  file_70.m_begin = (iterator)&local_e08;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_e18,
             msg_70);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_e28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e20 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_e28,0x20b,1,2,pbVar4,"fNegative",&local_98,"false");
  local_e38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e30 = "";
  local_e48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e40 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_71.m_end = pbVar4;
  msg_71.m_begin = pvVar2;
  file_71.m_end = (iterator)0x20c;
  file_71.m_begin = (iterator)&local_e38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_e48,
             msg_71);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_e58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e50 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_e58,0x20c,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0x20123456,&fNegative,&fOverflow);
  local_e68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e60 = "";
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_72.m_end = pbVar4;
  msg_72.m_begin = pvVar2;
  file_72.m_end = (iterator)0x20f;
  file_72.m_begin = (iterator)&local_e68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_e78,
             msg_72);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_e88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e80 = "";
  base_uint<256u>::GetHex_abi_cxx11_(&local_98,&num);
  pvVar2 = (iterator)0x2;
  psVar3 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
            (local_78,&local_e88,0x20f,1,2,psVar3,"num.GetHex()",
             "1234560000000000000000000000000000000000000000000000000000000000",
             "\"1234560000000000000000000000000000000000000000000000000000000000\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_e98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_e90 = "";
  local_ea8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_73.m_end = (iterator)psVar3;
  msg_73.m_begin = pvVar2;
  file_73.m_end = (iterator)0x210;
  file_73.m_begin = (iterator)&local_e98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_ea8,
             msg_73);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_eb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_eb0 = "";
  local_98._M_dataplus._M_p._0_4_ = arith_uint256::GetCompact(&num,false);
  psVar3 = &local_98;
  local_104 = 0x20123456;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_eb8,0x210,1,2,psVar3,"num.GetCompact()",&local_104,"0x20123456U");
  local_ec8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ec0 = "";
  local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_74.m_end = (iterator)psVar3;
  msg_74.m_begin = pvVar2;
  file_74.m_end = (iterator)0x211;
  file_74.m_begin = (iterator)&local_ec8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_ed8,
             msg_74);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_ee8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ee0 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_ee8,0x211,1,2,pbVar4,"fNegative",&local_98,"false");
  local_ef8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_ef0 = "";
  local_f08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f00 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_75.m_end = pbVar4;
  msg_75.m_begin = pvVar2;
  file_75.m_end = (iterator)0x212;
  file_75.m_begin = (iterator)&local_ef8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_f08,
             msg_75);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f10 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fOverflow;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_f18,0x212,1,2,&fOverflow,"fOverflow",&local_98,"false");
  arith_uint256::SetCompact(&num,0xff123456,&fNegative,&fOverflow);
  local_f28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f20 = "";
  local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f30 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_76.m_end = pbVar4;
  msg_76.m_begin = pvVar2;
  file_76.m_end = (iterator)0x215;
  file_76.m_begin = (iterator)&local_f28;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_f38,
             msg_76);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f40 = "";
  local_98._M_dataplus._M_p._0_4_ = (uint32_t)local_98._M_dataplus._M_p & 0xffffff00;
  pvVar2 = (iterator)0x2;
  pbVar4 = &fNegative;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_f48,0x215,1,2,pbVar4,"fNegative",&local_98,"false");
  local_f58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f50 = "";
  local_f68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_77.m_end = pbVar4;
  msg_77.m_begin = pvVar2;
  file_77.m_end = (iterator)0x216;
  file_77.m_begin = (iterator)&local_f58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_f68,
             msg_77);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/arith_uint256_tests.cpp"
  ;
  local_f70 = "";
  local_98._M_dataplus._M_p._0_4_ = CONCAT31(local_98._M_dataplus._M_p._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_f78,0x216,1,2,&fOverflow,"fOverflow",&local_98,"true");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bignum_SetCompact)
{
    arith_uint256 num;
    bool fNegative;
    bool fOverflow;
    num.SetCompact(0, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x00123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01003456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02000056, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03000000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04000000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x00923456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01803456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02800056, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03800000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04800000, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x01123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000000012");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x01120000U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    // Make sure that we don't generate compacts with the 0x00800000 bit set
    num = 0x80;
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x02008000U);

    num.SetCompact(0x01fedcba, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "000000000000000000000000000000000000000000000000000000000000007e");
    BOOST_CHECK_EQUAL(num.GetCompact(true), 0x01fe0000U);
    BOOST_CHECK_EQUAL(fNegative, true);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x02123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000001234");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x02123400U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x03123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000000123456");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x03123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000012345600");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x04123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x04923456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000012345600");
    BOOST_CHECK_EQUAL(num.GetCompact(true), 0x04923456U);
    BOOST_CHECK_EQUAL(fNegative, true);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x05009234, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "0000000000000000000000000000000000000000000000000000000092340000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x05009234U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0x20123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(num.GetHex(), "1234560000000000000000000000000000000000000000000000000000000000");
    BOOST_CHECK_EQUAL(num.GetCompact(), 0x20123456U);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, false);

    num.SetCompact(0xff123456, &fNegative, &fOverflow);
    BOOST_CHECK_EQUAL(fNegative, false);
    BOOST_CHECK_EQUAL(fOverflow, true);
}